

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

bool __thiscall Board::isSolveable(Board *this)

{
  uint uVar1;
  uint uVar2;
  TileValue TVar3;
  pointer pTVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  
  pTVar4 = (this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)(this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar4;
  bVar21 = lVar8 == 0;
  if (!bVar21) {
    uVar9 = lVar8 >> 3;
    uVar1 = this->SIZE;
    uVar2 = this->SQUARE_SIZE;
    uVar19 = (ulong)uVar1;
    uVar17 = (ulong)(uVar1 + (uVar1 == 0));
    uVar11 = 0;
    do {
      uVar10 = (uint)uVar11;
      if (pTVar4[uVar11].status != Empty) {
        TVar3 = pTVar4[uVar11].value;
        uVar5 = uVar11 / uVar19;
        uVar11 = uVar11 % uVar19;
        iVar6 = 0;
        bVar20 = false;
        uVar15 = 1;
        do {
          if ((uVar15 - uVar11 != 1) && (pTVar4[(uVar10 - (int)uVar11) + iVar6].value == TVar3))
          break;
          iVar6 = iVar6 + 1;
          bVar20 = uVar19 <= uVar15;
          bVar22 = uVar15 != uVar17;
          uVar15 = uVar15 + 1;
        } while (bVar22);
        if (!bVar20) {
          return bVar21;
        }
        iVar6 = 0;
        bVar20 = false;
        uVar15 = 1;
        do {
          if ((uVar15 - uVar5 != 1) && (pTVar4[iVar6 * uVar1 + (int)uVar11].value == TVar3)) break;
          iVar6 = iVar6 + 1;
          bVar20 = uVar19 <= uVar15;
          bVar22 = uVar15 != uVar17;
          uVar15 = uVar15 + 1;
        } while (bVar22);
        if (!bVar20) {
          return bVar21;
        }
        uVar13 = ((int)(uVar11 / uVar2) + (int)uVar5) - (int)(uVar5 % (ulong)uVar2);
        uVar7 = uVar13 / uVar2;
        uVar13 = uVar13 % uVar2;
        uVar12 = uVar7 * uVar2;
        uVar7 = (uVar7 + 1) * uVar2 - 1;
        bVar20 = uVar7 < uVar12;
        if (uVar12 <= uVar7) {
          uVar14 = uVar13 * uVar2;
          uVar13 = (uVar13 + 1) * uVar2 - 1;
          bVar20 = false;
          do {
            if (uVar14 <= uVar13) {
              uVar18 = uVar14;
              do {
                uVar16 = uVar12 * uVar1 + uVar18;
                if ((uVar16 != uVar10) && (pTVar4[uVar16].value == TVar3)) goto LAB_00104fe2;
                uVar18 = uVar18 + 1;
              } while (uVar18 <= uVar13);
            }
            uVar12 = uVar12 + 1;
            bVar20 = uVar7 < uVar12;
          } while (uVar12 <= uVar7);
        }
LAB_00104fe2:
        if (!bVar20) {
          return bVar21;
        }
      }
      uVar11 = (ulong)(uVar10 + 1);
      bVar21 = uVar9 <= uVar11;
    } while (uVar11 < uVar9);
  }
  return bVar21;
}

Assistant:

const bool Board::isSolveable() const
{
	for (unsigned int i = 0; i < _tiles.size(); i++)
	{
		if (_tiles[i].status != TileStatus::Empty && !isTileInsertionValid(i))
			return false;
	}

	return true;
}